

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# profiler_unittest.cc
# Opt level: O0

void test_other_thread(void)

{
  uint local_ac;
  int i;
  lock_guard<std::mutex> ml;
  char local_98 [4];
  int limit;
  char b [128];
  uint local_c;
  int result;
  
  ProfilerRegisterThread();
  local_c = 0;
  ml._M_device._4_4_ = *g_ticks_count + 0x1e;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffff58,&mutex)
  ;
  while (*g_ticks_count < ml._M_device._4_4_) {
    for (local_ac = 0; SBORROW4(local_ac,g_iters * 10) != (int)(local_ac + g_iters * -10) < 0;
        local_ac = local_ac + 1) {
      local_c = local_c ^ local_ac;
    }
    snprintf(local_98,0x80,"other: %d",(ulong)local_c);
    noopt<char*>(local_98);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&stack0xffffffffffffff58);
  return;
}

Assistant:

static void test_other_thread() {
#ifndef NO_THREADS
  ProfilerRegisterThread();

  int result = 0;
  char b[128];
  // Get at least 30 ticks
  int limit = *g_ticks_count + 30;

  std::lock_guard ml(mutex);

  while (*g_ticks_count < limit) {
    for (int i = 0; i < g_iters * 10; ++i ) {
      *const_cast<volatile int*>(&result) ^= i;
    }
    snprintf(b, sizeof(b), "other: %d", result);  // get some libc action
    (void)noopt(b); // 'consume' b. Ensure that smart compiler doesn't
                    // remove snprintf call
  }
#endif
}